

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::HttpServer::HttpServer
          (HttpServer *this,Timer *timer,HttpHeaderTable *requestHeaderTable,HttpService *service,
          Settings settings)

{
  OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>_> local_50;
  PromiseFulfillerPair<void> local_38;
  
  local_50.tag = 1;
  local_50.field_1.forceAligned = service;
  newPromiseAndFulfiller<void>();
  HttpServer(this,timer,requestHeaderTable,&local_50,settings,&local_38);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair(&local_38);
  OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>_>::~OneOf
            (&local_50);
  return;
}

Assistant:

HttpServer::HttpServer(kj::Timer& timer, HttpHeaderTable& requestHeaderTable, HttpService& service,
                       Settings settings)
    : HttpServer(timer, requestHeaderTable, &service, settings,
                 kj::newPromiseAndFulfiller<void>()) {}